

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void __thiscall
GlobalBailOutRecordDataTable::Finalize
          (GlobalBailOutRecordDataTable *this,Allocator *allocator,JitArenaAllocator *tempAlloc)

{
  code *pcVar1;
  bool bVar2;
  GlobalBailOutRecordDataRow *__dest;
  undefined4 *puVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint32 *puVar7;
  
  __dest = Memory::
           AllocateArray<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>>,GlobalBailOutRecordDataRow,false>
                     ((Memory *)allocator,
                      (AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>_> *)
                      NativeCodeData::
                      AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>_>::
                      AllocZero,0,(ulong)this->length);
  memcpy(__dest,this->globalBailOutRecordDataRows,(ulong)this->length << 4);
  Memory::DeleteArray<Memory::JitArenaAllocator,GlobalBailOutRecordDataRow>
            (tempAlloc,(ulong)this->length,this->globalBailOutRecordDataRows);
  this->globalBailOutRecordDataRows = __dest;
  uVar4 = this->length;
  this->size = uVar4;
  if (uVar4 != 0) {
    puVar7 = &__dest->start;
    lVar5 = 0x14;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (uVar6 = 1; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      if (*(uint *)((long)&__dest->offset + lVar5) < *puVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0xbb6,"(currStart <= globalBailOutRecordDataRows[i].start)",
                           "Rows in the table must be in order by start ID");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
        __dest = this->globalBailOutRecordDataRows;
        uVar4 = this->length;
      }
      puVar7 = (uint32 *)((long)&__dest->offset + lVar5);
      lVar5 = lVar5 + 0x10;
    }
  }
  return;
}

Assistant:

void GlobalBailOutRecordDataTable::Finalize(NativeCodeData::Allocator *allocator, JitArenaAllocator *tempAlloc)
{
    GlobalBailOutRecordDataRow *newRows = NativeCodeDataNewArrayZNoFixup(allocator, GlobalBailOutRecordDataRow, length);
    memcpy(newRows, globalBailOutRecordDataRows, sizeof(GlobalBailOutRecordDataRow) * length);
    JitAdeleteArray(tempAlloc, length, globalBailOutRecordDataRows);
    globalBailOutRecordDataRows = newRows;
    size = length;

#if DBG
    if (length > 0)
    {
        uint32 currStart = globalBailOutRecordDataRows[0].start;
        for (uint32 i = 1; i < length; i++)
        {
            AssertMsg(currStart <= globalBailOutRecordDataRows[i].start,
                      "Rows in the table must be in order by start ID");
            currStart = globalBailOutRecordDataRows[i].start;
        }
    }
#endif
}